

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.cpp
# Opt level: O0

char * pstore::utf::index(char *__s,int __c)

{
  size_t sVar1;
  undefined4 in_register_00000034;
  char *local_40;
  czstring result;
  czstring end;
  size_t pos_local;
  czstring str_local;
  
  if (__s == (char *)0x0) {
    str_local = (czstring)0x0;
  }
  else {
    sVar1 = strlen(__s);
    local_40 = index<char_const*>(__s,__s + sVar1,CONCAT44(in_register_00000034,__c));
    if (local_40 == __s + sVar1) {
      local_40 = (char *)0x0;
    }
    str_local = local_40;
  }
  return str_local;
}

Assistant:

auto index (gsl::czstring const str, std::size_t const pos) -> gsl::czstring {
            if (str == nullptr) {
                return nullptr;
            }
            gsl::czstring const end = str + std::strlen (str);
            gsl::czstring const result = index (str, end, pos);
            return result == end ? nullptr : result;
        }